

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.hpp
# Opt level: O0

void ovf::detail::endian::to_little_64(uint64_t *in,uint8_t *bytes)

{
  uint8_t *bytes_local;
  uint64_t *in_local;
  
  *bytes = (uint8_t)*in;
  bytes[1] = (uint8_t)(*in >> 8);
  bytes[2] = (uint8_t)(*in >> 0x10);
  bytes[3] = (uint8_t)(*in >> 0x18);
  bytes[4] = (uint8_t)(*in >> 0x20);
  bytes[5] = (uint8_t)(*in >> 0x28);
  bytes[6] = (uint8_t)(*in >> 0x30);
  bytes[7] = (uint8_t)(*in >> 0x38);
  return;
}

Assistant:

inline void to_little_64(const uint64_t & in, uint8_t * bytes)
    {
        bytes[0] = in >> 0;
        bytes[1] = in >> 8;
        bytes[2] = in >> 16;
        bytes[3] = in >> 24;
        bytes[4] = in >> 32;
        bytes[5] = in >> 40;
        bytes[6] = in >> 48;
        bytes[7] = in >> 56;
    }